

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::LoopWorkloadReferenceCase::writeWorkload
          (LoopWorkloadReferenceCase *this,ostringstream *dst,char *resultVariableName,
          char *inputVariableName)

{
  PerfCaseType PVar1;
  ostream *poVar2;
  int local_34;
  int i;
  bool isVertexCase;
  int loopIterations;
  char *inputVariableName_local;
  char *resultVariableName_local;
  ostringstream *dst_local;
  LoopWorkloadReferenceCase *this_local;
  
  PVar1 = (this->super_WorkloadReferenceCase).super_ControlStatementCase.super_ShaderPerformanceCase
          .m_caseType;
  poVar2 = std::operator<<((ostream *)dst,"\t");
  poVar2 = std::operator<<(poVar2,resultVariableName);
  std::operator<<(poVar2," = vec4(0.0);\n");
  for (local_34 = 0; local_34 < 0xb; local_34 = local_34 + 1) {
    std::operator<<((ostream *)dst,"\t");
    writeLoopWorkload(dst,resultVariableName,inputVariableName);
    std::operator<<((ostream *)dst,"\n");
  }
  if ((PVar1 != CASETYPE_VERTEX) && ((this->m_isAttributeStable & 1U) == 0)) {
    std::operator<<((ostream *)dst,"\tres.x = fract(res.x);\n");
  }
  return;
}

Assistant:

void LoopWorkloadReferenceCase::writeWorkload (std::ostringstream& dst, const char* resultVariableName, const char* inputVariableName) const
{
	const int	loopIterations	= 11;
	bool		isVertexCase	= m_caseType == CASETYPE_VERTEX;

	dst << "\t" << resultVariableName << " = vec4(0.0);\n";

	for (int i = 0; i < loopIterations; i++)
	{
		dst << "\t";
		writeLoopWorkload(dst, resultVariableName, inputVariableName);
		dst << "\n";
	}

	if (!isVertexCase && !m_isAttributeStable)
	{
		// Corresponds to the fract() done in a real test's fragment case with non-stable attribute.
		dst << "	res.x = fract(res.x);\n";
	}
}